

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseDefaultOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UChar separator,int32_t *parsedLen
          )

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  uint uVar5;
  undefined6 in_register_0000000a;
  char16_t cVar6;
  uint uVar7;
  int32_t iVar8;
  int iVar9;
  int32_t len;
  int32_t local_48;
  undefined4 local_44;
  TimeZoneFormat *local_40;
  int *local_38;
  
  local_44 = (undefined4)CONCAT62(in_register_0000000a,separator);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  len = 0;
  *parsedLen = 0;
  local_40 = this;
  local_48 = parseOffsetFieldWithLocalizedDigits(this,text,start,'\x01','\x02',0,0x17,&len);
  if (len == 0) {
    return 0;
  }
  uVar7 = len + start;
  iVar9 = len + start + 1;
  iVar8 = 0;
  local_38 = parsedLen;
  if (iVar9 < iVar3) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    cVar6 = L'\xffff';
    if (uVar7 < uVar5) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar4 = (text->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&text->fUnion + 2);
      }
      cVar6 = pcVar4[(int)uVar7];
    }
    if (cVar6 != (char16_t)local_44) goto LAB_002009a6;
    iVar2 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar9,'\x02','\x02',0,0x3b,&len);
    if (len != 0) {
      uVar7 = iVar9 + len;
      iVar9 = iVar9 + len + 1;
      if (iVar9 < iVar3) {
        sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar5 = (text->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)sVar1 >> 5;
        }
        cVar6 = L'\xffff';
        if (uVar7 < uVar5) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar4 = (text->fUnion).fFields.fArray;
          }
          else {
            pcVar4 = (char16_t *)((long)&text->fUnion + 2);
          }
          cVar6 = pcVar4[(int)uVar7];
        }
        if (cVar6 == (char16_t)local_44) {
          iVar3 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar9,'\x02','\x02',0,0x3b,&len)
          ;
          if (len != 0) {
            uVar7 = iVar9 + len;
          }
          iVar9 = iVar3 * 1000;
          goto LAB_002009aa;
        }
      }
    }
  }
  else {
LAB_002009a6:
    iVar2 = 0;
  }
  iVar9 = 0;
LAB_002009aa:
  if (uVar7 - start != 0) {
    *local_38 = uVar7 - start;
    iVar8 = iVar2 * 60000 + iVar9 + local_48 * 3600000;
  }
  return iVar8;
}

Assistant:

int32_t
TimeZoneFormat::parseDefaultOffsetFields(const UnicodeString& text, int32_t start, UChar separator, int32_t& parsedLen) const {
    int32_t max = text.length();
    int32_t idx = start;
    int32_t len = 0;
    int32_t hour = 0, min = 0, sec = 0;

    parsedLen = 0;

    do {
        hour = parseOffsetFieldWithLocalizedDigits(text, idx, 1, 2, 0, MAX_OFFSET_HOUR, len);
        if (len == 0) {
            break;
        }
        idx += len;

        if (idx + 1 < max && text.charAt(idx) == separator) {
            min = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            if (len == 0) {
                break;
            }
            idx += (1 + len);

            if (idx + 1 < max && text.charAt(idx) == separator) {
                sec = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_SECOND, len);
                if (len == 0) {
                    break;
                }
                idx += (1 + len);
            }
        }
    } while (FALSE);

    if (idx == start) {
        return 0;
    }

    parsedLen = idx - start;
    return hour * MILLIS_PER_HOUR + min * MILLIS_PER_MINUTE + sec * MILLIS_PER_SECOND;
}